

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eigrp-packet.cc
# Opt level: O2

void __thiscall SoftwareVersionTlv::SoftwareVersionTlv(SoftwareVersionTlv *this,istream *is)

{
  uint8_t arr [4];
  string local_a0;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  Tlv::Tlv(&this->super_Tlv,is);
  (this->super_Tlv)._vptr_Tlv = (_func_int **)&PTR__SoftwareVersionTlv_0012a1d8;
  (this->release_version)._M_dataplus._M_p = (pointer)&(this->release_version).field_2;
  (this->release_version)._M_string_length = 0;
  (this->release_version).field_2._M_local_buf[0] = '\0';
  (this->tlv_version)._M_dataplus._M_p = (pointer)&(this->tlv_version).field_2;
  (this->tlv_version)._M_string_length = 0;
  (this->tlv_version).field_2._M_local_buf[0] = '\0';
  std::istream::read((char *)is,(long)arr);
  std::__cxx11::to_string(&local_80,(uint)arr[0]);
  std::operator+(&local_60,&local_80,".");
  std::__cxx11::to_string(&local_a0,(uint)arr[1]);
  std::operator+(&local_40,&local_60,&local_a0);
  std::__cxx11::string::operator=((string *)&this->release_version,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::to_string(&local_80,(uint)arr[2]);
  std::operator+(&local_60,&local_80,".");
  std::__cxx11::to_string(&local_a0,(uint)arr[3]);
  std::operator+(&local_40,&local_60,&local_a0);
  std::__cxx11::string::operator=((string *)&this->tlv_version,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  return;
}

Assistant:

SoftwareVersionTlv::SoftwareVersionTlv(std::istream& is) : Tlv(is)
{
    uint8_t arr[4];
    is.read((char*)&arr, 4);
    release_version = std::to_string(arr[0]) + "." + std::to_string(arr[1]);
    tlv_version     = std::to_string(arr[2]) + "." + std::to_string(arr[3]);
}